

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

string * cmDocumentation::GeneralizeKeyword(string *__return_storage_ptr__,string *cname)

{
  _Base_ptr p_Var1;
  string *psVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  long lVar5;
  _Base_ptr b;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator<char> local_306;
  allocator<char> local_305;
  allocator<char> local_304;
  allocator<char> local_303;
  allocator_type local_302;
  allocator<char> local_301;
  allocator<char> local_300;
  allocator<char> local_2ff;
  allocator<char> local_2fe;
  allocator<char> local_2fd;
  allocator<char> local_2fc;
  allocator<char> local_2fb;
  allocator<char> local_2fa;
  allocator<char> local_2f9;
  string *local_2f8;
  string *local_2f0;
  _Rb_tree_node_base *local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  conversions;
  string local_280;
  RegularExpression reg;
  
  conversions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &conversions._M_t._M_impl.super__Rb_tree_header._M_header;
  conversions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  conversions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  conversions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2f8 = cname;
  conversions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       conversions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reg,"C",(allocator<char> *)&local_280);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(reg.regmatch.startp + 4),"CXX",(allocator<char> *)&configs);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(reg.regmatch.startp + 8),"CSharp",&local_303);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(reg.regmatch.startp + 0xc),"CUDA",&local_304);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(reg.regmatch.startp + 0x10),"OBJC",&local_305);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(reg.regmatch.startp + 0x14),"OBJCXX",&local_306);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(reg.regmatch.startp + 0x18),"Fortran",&local_2f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(reg.regmatch.startp + 0x1c),"HIP",&local_2fa);
  std::__cxx11::string::string<std::allocator<char>>((string *)reg.regmatch.endp,"ISPC",&local_2fb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(reg.regmatch.endp + 4),"Swift",&local_2fc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(reg.regmatch.endp + 8),"ASM",&local_2fd);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(reg.regmatch.endp + 0xc),"ASM_NASM",&local_2fe);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(reg.regmatch.endp + 0x10),"ASM_MARMASM",&local_2ff);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(reg.regmatch.endp + 0x14),"ASM_MASM",&local_300);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(reg.regmatch.endp + 0x18),"ASM-ATT",&local_301);
  __l._M_len = 0xf;
  __l._M_array = (iterator)&reg;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&languages,__l,&local_302);
  lVar5 = 0x1c0;
  do {
    std::__cxx11::string::~string((string *)((long)reg.regmatch.startp + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reg,"DEBUG",(allocator<char> *)&local_280);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(reg.regmatch.startp + 4),"RELEASE",&local_303);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(reg.regmatch.startp + 8),"RELWITHDEBINFO",&local_304);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(reg.regmatch.startp + 0xc),"MINSIZEREL",&local_305);
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&reg;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&configs,__l_00,(allocator_type *)&local_306);
  lVar5 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)reg.regmatch.startp + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  local_2f0 = __return_storage_ptr__;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>>>
  ::
  _M_emplace_unique<char_const(&)[5],std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>>>
              *)&conversions,(char (*) [5])"LANG",&languages);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>>>
  ::
  _M_emplace_unique<char_const(&)[7],std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>>>
              *)&conversions,(char (*) [7])0x7a5aa1,&configs);
  p_Var4 = conversions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (psVar2 = local_2f0,
        (_Rb_tree_header *)p_Var4 != &conversions._M_t._M_impl.super__Rb_tree_header) {
    p_Var1 = p_Var4[2]._M_parent;
    local_2e8 = p_Var4;
    for (b = *(_Base_ptr *)(p_Var4 + 2); b != p_Var1; b = b + 1) {
      cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[10]>
                (&local_280,(char (*) [7])"(^|_)(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)b,
                 (char (*) [10])")(\\.|$|_)");
      cmsys::RegularExpression::RegularExpression(&reg,&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      bVar3 = cmsys::RegularExpression::find(&reg,local_2f8);
      if (bVar3) {
        std::__cxx11::string::replace
                  ((ulong)local_2f8,(long)reg.regmatch.startp[2] - (long)reg.regmatch.searchstring,
                   (string *)b->_M_parent);
      }
      cmsys::RegularExpression::~RegularExpression(&reg);
    }
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(local_2e8);
  }
  std::__cxx11::string::string((string *)local_2f0,(string *)local_2f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&languages);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&conversions._M_t);
  return psVar2;
}

Assistant:

std::string cmDocumentation::GeneralizeKeyword(std::string cname)
{
  std::map<std::string, const std::vector<std::string>> conversions;
  std::vector<std::string> languages = {
    "C",      "CXX",      "CSharp",      "CUDA",     "OBJC",
    "OBJCXX", "Fortran",  "HIP",         "ISPC",     "Swift",
    "ASM",    "ASM_NASM", "ASM_MARMASM", "ASM_MASM", "ASM-ATT"
  };
  std::vector<std::string> configs = { "DEBUG", "RELEASE", "RELWITHDEBINFO",
                                       "MINSIZEREL" };
  conversions.emplace("LANG", std::move(languages));
  conversions.emplace("CONFIG", std::move(configs));
  for (auto const& it : conversions) {
    for (auto const& to_replace : it.second) {
      cmsys::RegularExpression reg(
        cmStrCat("(^|_)(", to_replace, ")(\\.|$|_)"));
      if (reg.find(cname)) {
        cname.replace(reg.start(2), to_replace.length(), it.first);
      }
    }
  }
  return cname;
}